

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::freeData
          (Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this)

{
  byte bVar1;
  long lVar2;
  
  if (this->entries != (Entry *)0x0) {
    lVar2 = 0;
    do {
      bVar1 = this->offsets[lVar2];
      if ((ulong)bVar1 != 0xff) {
        Node<QString,_QMimeTypeXMLData>::~Node
                  ((Node<QString,_QMimeTypeXMLData> *)
                   ((this->entries->storage).data + (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8));
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }